

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  u32 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Value *pVVar9;
  u64 uVar10;
  Ref RVar11;
  f32 fVar12;
  undefined1 local_81 [8];
  v128 v;
  Type local_50;
  Type type;
  int local_40;
  uint local_3c;
  Index i;
  Index num_operands;
  char *reftype;
  Value val;
  Index index_local;
  TraceSource *this_local;
  
  val.field_0._12_4_ = index;
  pVVar9 = Thread::Pick(this->thread_,index);
  reftype = (char *)(pVVar9->field_0).i64_;
  val.field_0.i64_ = *(u64 *)((long)&pVVar9->field_0 + 8);
  local_3c = 3;
  for (local_40 = 3; local_40 != 0; local_40 = local_40 + -1) {
    type = Opcode::GetParamType(&instr.op,local_40);
    bVar1 = wabt::operator==(type,Void);
    if (!bVar1) break;
    local_3c = local_3c - 1;
  }
  if (local_3c < (uint)val.field_0._12_4_) {
    Type::Type(&local_50,Void);
  }
  else {
    local_50 = Opcode::GetParamType(&instr.op,(local_3c - val.field_0._12_4_) + 1);
  }
  bVar1 = wabt::operator==(local_50,Void);
  if (bVar1) {
    EVar2 = Opcode::operator_cast_to_Enum(&instr.op);
    if (EVar2 - LocalSet < 2) {
      local_50 = GetLocalType(this,instr.field_2.imm_u32);
    }
    else if (EVar2 == GlobalSet) {
      local_50 = GetGlobalType(this,instr.field_2.imm_u32);
    }
    else {
      if ((1 < EVar2 - TableSet) && (EVar2 != TableFill)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"?",(allocator<char> *)(v.v + 8));
        std::allocator<char>::~allocator((allocator<char> *)(v.v + 8));
        return __return_storage_ptr__;
      }
      register0x00000000 = GetTableElementType(this,instr.field_2.imm_u32);
      local_50 = register0x00000000;
    }
  }
  EVar3 = Type::operator_cast_to_Enum(&local_50);
  switch(EVar3) {
  case ExnRef:
    _i = "exnref";
    goto LAB_00257ab2;
  default:
    abort();
  case ExternRef:
    _i = "externref";
    goto LAB_00257ab2;
  case FuncRef:
    _i = "funcref";
LAB_00257ab2:
    RVar11 = Value::Get<wabt::interp::Ref>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",_i,RVar11.index);
    break;
  case V128:
    _local_81 = Value::Get<v128>((Value *)&reftype);
    uVar5 = v128::u32((v128 *)local_81,0);
    uVar6 = v128::u32((v128 *)local_81,1);
    uVar7 = v128::u32((v128 *)local_81,2);
    uVar8 = v128::u32((v128 *)local_81,3);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",(ulong)uVar5,(ulong)uVar6,
               (ulong)uVar7,(ulong)uVar8);
    break;
  case F64:
    Value::Get<double>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g");
    break;
  case F32:
    fVar12 = Value::Get<float>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",(double)(float)fVar12);
    break;
  case I64:
    uVar10 = Value::Get<unsigned_long>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",uVar10);
    break;
  case I32:
    uVar4 = Value::Get<unsigned_int>((Value *)&reftype);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",(ulong)uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // Estimate number of operands.
  // TODO: Instead, record this accurately in opcode.def.
  Index num_operands = 3;
  for (Index i = 3; i >= 1; i--) {
    if (instr.op.GetParamType(i) == ValueType::Void) {
      num_operands--;
    } else {
      break;
    }
  }
  auto type = index > num_operands
                  ? Type(ValueType::Void)
                  : instr.op.GetParamType(num_operands - index + 1);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

      // clang-format off
    case ValueType::FuncRef:    reftype = "funcref"; break;
    case ValueType::ExternRef:  reftype = "externref"; break;
    case ValueType::ExnRef:     reftype = "exnref"; break;
      // clang-format on

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}